

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O0

void __thiscall Psbt_UsecaseMultisig_Test::TestBody(Psbt_UsecaseMultisig_Test *this)

{
  initializer_list<cfd::core::Pubkey> __l;
  initializer_list<cfd::core::Pubkey> __l_00;
  initializer_list<cfd::core::KeyData> __l_01;
  initializer_list<cfd::core::ByteData> __l_02;
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  reference pvVar4;
  Amount *value;
  Amount AVar5;
  AssertionResult gtest_ar_21;
  CfdException *except_9;
  AssertionResult gtest_ar_20;
  Transaction tx_1;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_19;
  CfdException *except_8;
  AssertionResult gtest_ar_18;
  Script exp_script;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> wsh_script;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> wit_script;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  Script script;
  ByteData sig2;
  ByteData sig1;
  AssertionResult gtest_ar_14;
  CfdException *except_7;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  CfdException *except_6;
  ByteData sig;
  ByteData256 sighash;
  Transaction tx;
  TxOut utxo_txout;
  SigHashType sighash_type;
  AssertionResult gtest_ar_10;
  CfdException *except_5;
  AssertionResult gtest_ar_9;
  CfdException *except_4;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  CfdException *except_3;
  Psbt psbt2;
  AssertionResult gtest_ar_5;
  CfdException *except_2;
  Psbt psbt1;
  AssertionResult gtest_ar_4;
  CfdException *except_1;
  Amount amount;
  AssertionResult gtest_ar_3;
  CfdException *except;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  TxIn txin;
  Transaction utxo_tx;
  AssertionResult gtest_ar;
  Script multisig;
  KeyData key_in2;
  KeyData key_in1;
  string in_path;
  Address addr;
  Script out_multisig;
  KeyData key2;
  KeyData key1;
  string path1;
  HDWallet wallet2;
  HDWallet wallet1;
  Psbt psbt;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffe1fc;
  Address *in_stack_ffffffffffffe200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe208;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *in_stack_ffffffffffffe210;
  char *in_stack_ffffffffffffe218;
  allocator_type *in_stack_ffffffffffffe228;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *in_stack_ffffffffffffe230;
  iterator in_stack_ffffffffffffe238;
  KeyData *in_stack_ffffffffffffe240;
  Psbt *in_stack_ffffffffffffe2b8;
  ByteData *pBVar7;
  Psbt *in_stack_ffffffffffffe2c0;
  ByteData *pBVar8;
  undefined8 ***local_1be8;
  Pubkey *local_1b28;
  Pubkey *local_1b00;
  AssertHelper local_1ac0;
  Message local_1ab8;
  string local_1ab0;
  AssertionResult local_1a90;
  Transaction local_1a80;
  string local_1a40;
  AssertHelper local_1a20;
  Message local_1a18;
  undefined1 local_1a09;
  AssertionResult local_1a08 [3];
  AssertHelper local_19d0;
  Message local_19c8;
  string local_19c0;
  ByteData local_19a0;
  ByteData local_1988;
  string local_1970;
  AssertionResult local_1950;
  Script local_1940;
  AssertHelper local_1908;
  Message local_1900;
  size_type local_18f8;
  undefined4 local_18ec;
  AssertionResult local_18e8;
  AssertHelper local_18d8;
  Message local_18d0;
  string local_18c8;
  string local_18a8;
  AssertionResult local_1888;
  AssertHelper local_1878;
  Message local_1870;
  size_type local_1868;
  undefined4 local_185c;
  AssertionResult local_1858;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_1848;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_1830;
  string local_1818;
  AssertHelper local_17f8;
  Message local_17f0;
  undefined1 local_17e1;
  AssertionResult local_17e0;
  ByteData *local_17c8;
  ByteData local_17c0;
  undefined1 local_17a8 [24];
  undefined1 local_1790 [24];
  ByteData local_1778;
  undefined1 local_1760 [40];
  string local_1738;
  AssertHelper local_1718;
  Message local_1710;
  byte local_1701;
  AssertionResult local_1700;
  string local_16f0;
  AssertHelper local_16d0;
  Message local_16c8;
  byte local_16b9;
  AssertionResult local_16b8;
  Script local_16a8;
  Pubkey local_1670;
  ByteData local_1658;
  Pubkey local_1640;
  ByteData local_1628 [2];
  AssertHelper local_15e8;
  Message local_15e0;
  string local_15d8;
  AssertionResult local_15b8;
  AssertHelper local_15a8;
  Message local_15a0;
  ByteData local_1598;
  string local_1580;
  AssertionResult local_1560 [3];
  ByteData local_1528;
  Privkey local_1510;
  ByteData local_14f0;
  int64_t local_14d8;
  undefined1 local_14d0;
  Amount local_14c8;
  SigHashType local_14b4;
  Script local_14a8;
  ByteData local_1470;
  ByteData256 local_1458;
  Transaction local_1440;
  AbstractTxOut local_1400;
  undefined1 local_13ac [124];
  AssertHelper local_1330;
  Message local_1328;
  string local_1320;
  AssertionResult local_1300;
  AssertHelper local_12f0;
  Message local_12e8;
  ByteData local_12e0;
  string local_12c8;
  AssertionResult local_12a8 [3];
  TxOutReference local_1270;
  Psbt local_1220 [2];
  TxOutReference local_1178;
  Psbt local_1128 [2];
  undefined1 ***local_1078;
  undefined8 **local_1070 [42];
  undefined1 local_f20 [336];
  undefined1 ***local_dd0;
  undefined8 local_dc8;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_dc0;
  Script local_da8;
  Amount local_d70 [3];
  AssertHelper local_d38;
  Message local_d30;
  Script local_d28;
  string local_cf0;
  AssertionResult local_cd0;
  AssertHelper local_cc0;
  Message local_cb8;
  Script local_cb0;
  string local_c78;
  AssertionResult local_c58;
  SigHashType local_c44;
  KeyData local_c38;
  TxOutReference local_ae8;
  allocator local_a91;
  string local_a90;
  Txid local_a70;
  TxIn local_a50;
  Transaction local_9c0;
  AssertHelper local_980;
  Message local_978;
  string local_970;
  AssertionResult local_950;
  Pubkey *local_938;
  Pubkey local_930;
  Pubkey local_918;
  undefined1 local_900 [40];
  Script local_8d8;
  KeyData local_8a0;
  KeyData local_750;
  allocator local_5f9;
  string local_5f8;
  Address local_5d8;
  Pubkey *local_458;
  Pubkey local_450;
  Pubkey local_438;
  undefined1 local_420 [40];
  Script local_3f8;
  KeyData local_3c0;
  KeyData local_270;
  allocator local_119;
  string local_118;
  ByteData local_f8;
  HDWallet local_e0;
  ByteData local_b8;
  HDWallet local_a0;
  Psbt local_88;
  
  cfd::Psbt::Psbt((Psbt *)in_stack_ffffffffffffe200);
  cfd::core::ByteData::ByteData(&local_b8,&g_psbt_seed1_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(&local_a0,&local_b8);
  cfd::core::ByteData::~ByteData((ByteData *)0x2a13d6);
  cfd::core::ByteData::ByteData(&local_f8,&g_psbt_seed2_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(&local_e0,&local_f8);
  cfd::core::ByteData::~ByteData((ByteData *)0x2a1410);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"44h/0h/0h/0/12",&local_119);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  cfd::core::HDWallet::GeneratePubkeyData(&local_270,&local_a0,kTestnet,&local_118);
  cfd::core::HDWallet::GeneratePubkeyData(&local_3c0,&local_e0,kTestnet,&local_118);
  local_458 = &local_450;
  cfd::core::KeyData::GetPubkey(local_458,&local_270);
  local_458 = &local_438;
  cfd::core::KeyData::GetPubkey(local_458,&local_3c0);
  local_420._0_8_ = &local_450;
  local_420._8_8_ = (pointer)0x2;
  std::allocator<cfd::core::Pubkey>::allocator((allocator<cfd::core::Pubkey> *)0x2a1507);
  __l._M_len = (size_type)in_stack_ffffffffffffe240;
  __l._M_array = &in_stack_ffffffffffffe238->pubkey_;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
             in_stack_ffffffffffffe230,__l,(allocator_type *)in_stack_ffffffffffffe228);
  cfd::core::ScriptUtil::CreateMultisigRedeemScript
            (&local_3f8,2,
             (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_420 + 0x10),
             true);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
             in_stack_ffffffffffffe210);
  std::allocator<cfd::core::Pubkey>::~allocator((allocator<cfd::core::Pubkey> *)0x2a1569);
  local_1b00 = (Pubkey *)local_420;
  do {
    local_1b00 = local_1b00 + -1;
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x2a159e);
  } while (local_1b00 != &local_450);
  cfd::core::Address::Address(&local_5d8,kCfdIllegalArgumentError,kVersion0,&local_3f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5f8,"44h/0h/0h/0/11",&local_5f9);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
  cfd::core::HDWallet::GeneratePrivkeyData(&local_750,&local_a0,kTestnet,&local_5f8);
  cfd::core::HDWallet::GeneratePrivkeyData(&local_8a0,&local_e0,kTestnet,&local_5f8);
  local_938 = &local_930;
  cfd::core::KeyData::GetPubkey(local_938,&local_750);
  local_938 = &local_918;
  cfd::core::KeyData::GetPubkey(local_938,&local_8a0);
  local_900._0_8_ = &local_930;
  local_900._8_8_ = (pointer)0x2;
  std::allocator<cfd::core::Pubkey>::allocator((allocator<cfd::core::Pubkey> *)0x2a16d0);
  __l_00._M_len = (size_type)in_stack_ffffffffffffe240;
  __l_00._M_array = &in_stack_ffffffffffffe238->pubkey_;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
             in_stack_ffffffffffffe230,__l_00,(allocator_type *)in_stack_ffffffffffffe228);
  cfd::core::ScriptUtil::CreateMultisigRedeemScript
            (&local_8d8,2,
             (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_900 + 0x10),
             true);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
             in_stack_ffffffffffffe210);
  std::allocator<cfd::core::Pubkey>::~allocator((allocator<cfd::core::Pubkey> *)0x2a1732);
  local_1b28 = (Pubkey *)local_900;
  do {
    local_1b28 = local_1b28 + -1;
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x2a1767);
  } while (local_1b28 != &local_930);
  cfd::core::Script::GetHex_abi_cxx11_(&local_970,&local_8d8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_950,
             "\"522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae\""
             ,"multisig.GetHex().c_str()",
             "522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_970);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_950);
  if (!bVar1) {
    testing::Message::Message(&local_978);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2a1bd0);
    testing::internal::AssertHelper::AssertHelper
              (&local_980,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x455,pcVar2);
    testing::internal::AssertHelper::operator=(&local_980,&local_978);
    testing::internal::AssertHelper::~AssertHelper(&local_980);
    testing::Message::~Message((Message *)0x2a1c33);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2a1c8b);
  cfd::core::Transaction::Transaction(&local_9c0,&g_psbt_utxo_sh_wsh_multi_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a90,"544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69"
             ,&local_a91);
  cfd::core::Txid::Txid(&local_a70,&local_a90);
  cfd::core::TxIn::TxIn(&local_a50,&local_a70,0,0xffffffff);
  cfd::core::Txid::~Txid((Txid *)0x2a1d16);
  std::__cxx11::string::~string((string *)&local_a90);
  std::allocator<char>::~allocator((allocator<char> *)&local_a91);
  cfd::core::Psbt::AddTxIn(&local_88,&local_a50);
  cfd::core::Transaction::GetTxOut(&local_ae8,&local_9c0,0);
  cfd::core::KeyData::KeyData(&local_c38);
  cfd::core::Psbt::SetTxInUtxo(&local_88,0,&local_ae8,&local_8d8,&local_c38);
  cfd::core::KeyData::~KeyData((KeyData *)in_stack_ffffffffffffe200);
  cfd::core::TxOutReference::~TxOutReference((TxOutReference *)0x2a1db2);
  cfd::core::SigHashType::SigHashType(&local_c44);
  cfd::core::Psbt::SetTxInSighashType(&local_88,0,&local_c44);
  cfd::core::Psbt::GetTxInRedeemScriptDirect(&local_cb0,&local_88,0,true,true);
  cfd::core::Script::GetHex_abi_cxx11_(&local_c78,&local_cb0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_c58,
             "\"522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae\""
             ,"psbt.GetTxInRedeemScriptDirect(0, true, true).GetHex().c_str()",
             "522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_c78);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffe200);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c58);
  if (!bVar1) {
    testing::Message::Message(&local_cb8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2a1fea);
    testing::internal::AssertHelper::AssertHelper
              (&local_cc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x45f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_cc0,&local_cb8);
    testing::internal::AssertHelper::~AssertHelper(&local_cc0);
    testing::Message::~Message((Message *)0x2a204d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2a20a5);
  cfd::core::Psbt::GetTxInRedeemScriptDirect(&local_d28,&local_88,0,true,false);
  cfd::core::Script::GetHex_abi_cxx11_(&local_cf0,&local_d28);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_cd0,
             "\"00209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9\"",
             "psbt.GetTxInRedeemScriptDirect(0, true, false).GetHex().c_str()",
             "00209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9",pcVar2);
  std::__cxx11::string::~string((string *)&local_cf0);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffe200);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_cd0);
  if (!bVar1) {
    testing::Message::Message(&local_d30);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2a21e4);
    testing::internal::AssertHelper::AssertHelper
              (&local_d38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x461,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d38,&local_d30);
    testing::internal::AssertHelper::~AssertHelper(&local_d38);
    testing::Message::~Message((Message *)0x2a2247);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2a229c);
  cfd::core::Amount::Amount(local_d70,0x1dcd4b10);
  cfd::core::Address::GetLockingScript(&local_da8,&local_5d8);
  cfd::core::Psbt::AddTxOut(&local_88,&local_da8,local_d70);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffe200);
  local_1078 = (undefined1 ***)local_1070;
  cfd::core::KeyData::KeyData(in_stack_ffffffffffffe240,in_stack_ffffffffffffe238);
  local_1078 = (undefined1 ***)local_f20;
  cfd::core::KeyData::KeyData(in_stack_ffffffffffffe240,in_stack_ffffffffffffe238);
  local_dd0 = (undefined1 ***)local_1070;
  local_dc8 = 2;
  std::allocator<cfd::core::KeyData>::allocator((allocator<cfd::core::KeyData> *)0x2a2586);
  __l_01._M_len = (size_type)in_stack_ffffffffffffe240;
  __l_01._M_array = in_stack_ffffffffffffe238;
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
             in_stack_ffffffffffffe230,__l_01,(allocator_type *)in_stack_ffffffffffffe228);
  cfd::core::Psbt::SetTxOutData(&local_88,0,&local_3f8,&local_dc0);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
             in_stack_ffffffffffffe210);
  std::allocator<cfd::core::KeyData>::~allocator((allocator<cfd::core::KeyData> *)0x2a25e8);
  local_1be8 = &local_dd0;
  do {
    local_1be8 = local_1be8 + -0x2a;
    cfd::core::KeyData::~KeyData((KeyData *)in_stack_ffffffffffffe200);
  } while (local_1be8 != local_1070);
  cfd::Psbt::Psbt((Psbt *)in_stack_ffffffffffffe200);
  cfd::core::Psbt::AddTxIn(local_1128,&local_a50);
  cfd::core::Transaction::GetTxOut(&local_1178,&local_9c0,0);
  cfd::core::Psbt::SetTxInUtxo(local_1128,0,&local_1178,&local_8d8,&local_750);
  cfd::core::TxOutReference::~TxOutReference((TxOutReference *)0x2a2a2f);
  cfd::Psbt::Psbt((Psbt *)in_stack_ffffffffffffe200);
  cfd::core::Psbt::AddTxIn(local_1220,&local_a50);
  cfd::core::Transaction::GetTxOut(&local_1270,&local_9c0,0);
  cfd::core::Psbt::SetTxInUtxo(local_1220,0,&local_1270,&local_8d8,&local_8a0);
  cfd::core::TxOutReference::~TxOutReference((TxOutReference *)0x2a2cf2);
  cfd::core::Psbt::Join(&local_88,local_1128,false);
  cfd::core::Psbt::Join(&local_88,local_1220,false);
  cfd::core::Psbt::GetData(&local_12e0,&local_88);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_12c8,&local_12e0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_12a8,
             "\"70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f23175870103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f23175870103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_12c8);
  cfd::core::ByteData::~ByteData((ByteData *)0x2a3007);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_12a8);
  if (!bVar1) {
    testing::Message::Message(&local_12e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2a30c9);
    testing::internal::AssertHelper::AssertHelper
              (&local_12f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x485,pcVar2);
    testing::internal::AssertHelper::operator=(&local_12f0,&local_12e8);
    testing::internal::AssertHelper::~AssertHelper(&local_12f0);
    testing::Message::~Message((Message *)0x2a312c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2a3184);
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_1320,&local_88);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1300,
             "\"cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQMEAQAAAAEEIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBBUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSriIGA6US9fWcDnkB/EeO1jU+73b0T5yywYW/vPfwubt2cWvzGCpwR2AsAACAAAAAgAAAAIAAAAAACwAAACIGA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHGJ1rbYYsAACAAAAAgAAAAIAAAAAACwAAAAABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA=\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQMEAQAAAAEEIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBBUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSriIGA6US9fWcDnkB/EeO1jU+73b0T5yywYW/vPfwubt2cWvzGCpwR2AsAACAAAAAgAAAAIAAAAAACwAAACIGA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHGJ1rbYYsAACAAAAAgAAAAIAAAAAACwAAAAABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA="
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_1320);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1300);
  if (!bVar1) {
    testing::Message::Message(&local_1328);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2a3271);
    testing::internal::AssertHelper::AssertHelper
              (&local_1330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x486,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1330,&local_1328);
    testing::internal::AssertHelper::~AssertHelper(&local_1330);
    testing::Message::~Message((Message *)0x2a32d4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2a3329);
  cfd::Psbt::operator=(in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2b8);
  cfd::core::KeyData::GetPrivkey((Privkey *)(local_13ac + 0x34),&local_750);
  cfd::core::Psbt::Sign(local_1128,(Privkey *)(local_13ac + 0x34),true);
  cfd::core::Privkey::~Privkey((Privkey *)0x2a35a4);
  cfd::Psbt::operator=(in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2b8);
  cfd::core::Psbt::GetTxInSighashType((Psbt *)local_13ac,(uint32_t)&local_88);
  cfd::core::Psbt::GetTxInUtxo((TxOut *)&local_1400,&local_88,0,false,(bool *)0x0);
  cfd::core::Psbt::GetTransaction(&local_1440,&local_88);
  cfd::core::Psbt::GetTxInRedeemScript(&local_14a8,&local_88,0,false,(bool *)0x0);
  cfd::core::Script::GetData(&local_1470,&local_14a8);
  cfd::core::SigHashType::SigHashType(&local_14b4,(SigHashType *)local_13ac);
  AVar5 = cfd::core::AbstractTxOut::GetValue(&local_1400);
  local_14d8 = AVar5.amount_;
  local_14d0 = AVar5.ignore_check_;
  uVar6 = 0;
  value = &local_14c8;
  local_14c8.amount_ = local_14d8;
  local_14c8.ignore_check_ = (bool)local_14d0;
  cfd::core::Transaction::GetSignatureHash
            (&local_1458,&local_1440,0,&local_1470,&local_14b4,value,kVersion0);
  cfd::core::ByteData::~ByteData((ByteData *)0x2a3944);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffe200);
  cfd::core::KeyData::GetPrivkey(&local_1510,&local_8a0);
  cfd::core::Privkey::CalculateEcSignature(&local_14f0,&local_1510,&local_1458,true);
  cfd::core::Privkey::~Privkey((Privkey *)0x2a3999);
  cfd::core::CryptoUtil::ConvertSignatureToDer(&local_1528,&local_14f0,(SigHashType *)local_13ac);
  cfd::core::ByteData::operator=
            ((ByteData *)in_stack_ffffffffffffe200,
             (ByteData *)CONCAT44(in_stack_ffffffffffffe1fc,uVar6));
  cfd::core::ByteData::~ByteData((ByteData *)0x2a39ea);
  cfd::core::Psbt::SetTxInSignature(local_1220,0,&local_8a0,&local_14f0);
  cfd::core::ByteData::~ByteData((ByteData *)0x2a3a18);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x2a3a25);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_ffffffffffffe200);
  cfd::core::TxOut::~TxOut((TxOut *)0x2a3a3f);
  cfd::core::Psbt::Combine(&local_88,local_1128);
  cfd::core::Psbt::Combine(&local_88,local_1220);
  cfd::core::Psbt::GetData(&local_1598,&local_88);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1580,&local_1598);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1560,
             "\"70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587220203a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401220203f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4747304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc010103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587220203a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401220203f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4747304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc010103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_1580);
  cfd::core::ByteData::~ByteData((ByteData *)0x2a3e12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1560);
  if (!bVar1) {
    testing::Message::Message(&local_15a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2a3ed4);
    testing::internal::AssertHelper::AssertHelper
              (&local_15a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x4a8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_15a8,&local_15a0);
    testing::internal::AssertHelper::~AssertHelper(&local_15a8);
    testing::Message::~Message((Message *)0x2a3f37);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2a3f8f);
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_15d8,&local_88);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_15b8,
             "\"cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQFHUiECkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnshAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCUq4iAgJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQhida22GLAAAgAAAAIAAAACAAAAAAAwAAAAiAgKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGexgqcEdgLAAAgAAAAIAAAACAAAAAAAwAAAAA\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQFHUiECkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnshAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCUq4iAgJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQhida22GLAAAgAAAAIAAAACAAAAAAAwAAAAiAgKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGexgqcEdgLAAAgAAAAIAAAACAAAAAAAwAAAAA"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_15d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_15b8);
  if (!bVar1) {
    testing::Message::Message(&local_15e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2a407c);
    testing::internal::AssertHelper::AssertHelper
              (&local_15e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x4a9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_15e8,&local_15e0);
    testing::internal::AssertHelper::~AssertHelper(&local_15e8);
    testing::Message::~Message((Message *)0x2a40df);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2a4134);
  cfd::core::KeyData::GetPubkey(&local_1640,&local_750);
  cfd::core::Psbt::GetTxInSignature(local_1628,&local_88,0,&local_1640);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2a439d);
  cfd::core::KeyData::GetPubkey(&local_1670,&local_8a0);
  cfd::core::Psbt::GetTxInSignature(&local_1658,&local_88,0,&local_1670);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2a43e2);
  cfd::core::Psbt::GetTxInRedeemScript(&local_16a8,&local_88,0,false,(bool *)0x0);
  bVar1 = cfd::core::Psbt::IsFinalizedInput(&local_88,0);
  local_16b9 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffe200,
             (bool *)CONCAT44(in_stack_ffffffffffffe1fc,uVar6),(type *)0x2a4443);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_16b8);
  if (!bVar1) {
    testing::Message::Message(&local_16c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_16f0,(internal *)&local_16b8,(AssertionResult *)"psbt.IsFinalizedInput(0)",
               "true","false",(char *)value);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_16d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x4b3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_16d0,&local_16c8);
    testing::internal::AssertHelper::~AssertHelper(&local_16d0);
    std::__cxx11::string::~string((string *)&local_16f0);
    testing::Message::~Message((Message *)0x2a45e2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2a465a);
  bVar1 = cfd::core::Psbt::IsFinalized(&local_88);
  local_1701 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffe200,
             (bool *)CONCAT44(in_stack_ffffffffffffe1fc,uVar6),(type *)0x2a469b);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1700);
  if (!bVar1) {
    testing::Message::Message(&local_1710);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1738,(internal *)&local_1700,(AssertionResult *)"psbt.IsFinalized()","true",
               "false",(char *)value);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1718,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x4b4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1718,&local_1710);
    testing::internal::AssertHelper::~AssertHelper(&local_1718);
    std::__cxx11::string::~string((string *)&local_1738);
    testing::Message::~Message((Message *)0x2a4799);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2a4814);
  local_17c8 = &local_17c0;
  cfd::core::ByteData::ByteData(local_17c8);
  local_17c8 = (ByteData *)local_17a8;
  cfd::core::ByteData::ByteData
            ((ByteData *)in_stack_ffffffffffffe200,
             (ByteData *)CONCAT44(in_stack_ffffffffffffe1fc,uVar6));
  local_17c8 = (ByteData *)local_1790;
  cfd::core::ByteData::ByteData
            ((ByteData *)in_stack_ffffffffffffe200,
             (ByteData *)CONCAT44(in_stack_ffffffffffffe1fc,uVar6));
  local_17c8 = &local_1778;
  cfd::core::Script::GetData(local_17c8,&local_16a8);
  local_1760._0_8_ = &local_17c0;
  local_1760._8_8_ = (pointer)0x4;
  std::allocator<cfd::core::ByteData>::allocator((allocator<cfd::core::ByteData> *)0x2a48b9);
  __l_02._M_len = (size_type)in_stack_ffffffffffffe240;
  __l_02._M_array = (iterator)in_stack_ffffffffffffe238;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (in_stack_ffffffffffffe230,__l_02,in_stack_ffffffffffffe228);
  cfd::core::Psbt::SetTxInFinalScript
            (&local_88,0,
             (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             (local_1760 + 0x10));
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (in_stack_ffffffffffffe210);
  std::allocator<cfd::core::ByteData>::~allocator((allocator<cfd::core::ByteData> *)0x2a4913);
  pBVar7 = &local_17c0;
  pBVar8 = (ByteData *)local_1760;
  do {
    pBVar8 = pBVar8 + -1;
    cfd::core::ByteData::~ByteData((ByteData *)0x2a4948);
  } while (pBVar8 != pBVar7);
  local_17e1 = cfd::core::Psbt::IsFinalizedInput(&local_88,0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffe200,
             (bool *)CONCAT44(in_stack_ffffffffffffe1fc,uVar6),(type *)0x2a49a6);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_17e0);
  if (!bVar1) {
    testing::Message::Message(&local_17f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1818,(internal *)&local_17e0,(AssertionResult *)"psbt.IsFinalizedInput(0)",
               "false","true",(char *)value);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_17f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x4b8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_17f8,&local_17f0);
    testing::internal::AssertHelper::~AssertHelper(&local_17f8);
    std::__cxx11::string::~string((string *)&local_1818);
    testing::Message::~Message((Message *)0x2a4bae);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2a4c29);
  cfd::core::Psbt::ClearTxInSignData(&local_88,0);
  cfd::core::Psbt::GetTxInFinalScript(&local_1830,&local_88,0,true);
  cfd::core::Psbt::GetTxInFinalScript(&local_1848,&local_88,0,false);
  local_185c = 4;
  local_1868 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                         (&local_1830);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            (in_stack_ffffffffffffe218,(char *)in_stack_ffffffffffffe210,
             (int *)in_stack_ffffffffffffe208,(unsigned_long *)in_stack_ffffffffffffe200);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1858);
  if (!bVar1) {
    testing::Message::Message(&local_1870);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2a4d61);
    testing::internal::AssertHelper::AssertHelper
              (&local_1878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x4bd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1878,&local_1870);
    testing::internal::AssertHelper::~AssertHelper(&local_1878);
    testing::Message::~Message((Message *)0x2a4dbe);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2a4e16);
  sVar3 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size(&local_1830);
  if (sVar3 == 4) {
    cfd::core::Script::GetHex_abi_cxx11_(&local_18a8,&local_16a8);
    pvVar4 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       (&local_1830,3);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_18c8,pvVar4);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              (in_stack_ffffffffffffe218,(char *)in_stack_ffffffffffffe210,in_stack_ffffffffffffe208
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_ffffffffffffe200);
    std::__cxx11::string::~string((string *)&local_18c8);
    std::__cxx11::string::~string((string *)&local_18a8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1888);
    if (!bVar1) {
      testing::Message::Message(&local_18d0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2a4f68);
      testing::internal::AssertHelper::AssertHelper
                (&local_18d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
                 ,0x4bf,pcVar2);
      testing::internal::AssertHelper::operator=(&local_18d8,&local_18d0);
      testing::internal::AssertHelper::~AssertHelper(&local_18d8);
      testing::Message::~Message((Message *)0x2a4fc5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2a501a);
  }
  local_18ec = 1;
  local_18f8 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                         (&local_1848);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            (in_stack_ffffffffffffe218,(char *)in_stack_ffffffffffffe210,
             (int *)in_stack_ffffffffffffe208,(unsigned_long *)in_stack_ffffffffffffe200);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18e8);
  if (!bVar1) {
    testing::Message::Message(&local_1900);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2a50d2);
    testing::internal::AssertHelper::AssertHelper
              (&local_1908,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x4c1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1908,&local_1900);
    testing::internal::AssertHelper::~AssertHelper(&local_1908);
    testing::Message::~Message((Message *)0x2a512f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2a5187);
  sVar3 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size(&local_1848);
  if (sVar3 == 1) {
    cfd::core::ScriptUtil::CreateP2wshLockingScript(&local_1940,&local_16a8);
    cfd::core::Script::GetData(&local_19a0,&local_1940);
    cfd::core::ByteData::Serialize(&local_1988,&local_19a0);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_1970,&local_1988);
    pvVar4 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       (&local_1848,0);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_19c0,pvVar4);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              (in_stack_ffffffffffffe218,(char *)in_stack_ffffffffffffe210,in_stack_ffffffffffffe208
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_ffffffffffffe200);
    std::__cxx11::string::~string((string *)&local_19c0);
    std::__cxx11::string::~string((string *)&local_1970);
    cfd::core::ByteData::~ByteData((ByteData *)0x2a5278);
    cfd::core::ByteData::~ByteData((ByteData *)0x2a5285);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1950);
    if (!bVar1) {
      testing::Message::Message(&local_19c8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2a5399);
      testing::internal::AssertHelper::AssertHelper
                (&local_19d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
                 ,0x4c4,pcVar2);
      testing::internal::AssertHelper::operator=(&local_19d0,&local_19c8);
      testing::internal::AssertHelper::~AssertHelper(&local_19d0);
      testing::Message::~Message((Message *)0x2a53f6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2a544b);
    cfd::core::Script::~Script((Script *)in_stack_ffffffffffffe200);
  }
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (in_stack_ffffffffffffe210);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (in_stack_ffffffffffffe210);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffe200);
  cfd::core::ByteData::~ByteData((ByteData *)0x2a54aa);
  cfd::core::ByteData::~ByteData((ByteData *)0x2a54b7);
  local_1a09 = cfd::core::Psbt::IsFinalized(&local_88);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffe200,
             (bool *)CONCAT44(in_stack_ffffffffffffe1fc,uVar6),(type *)0x2a5733);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1a08);
  if (!bVar1) {
    testing::Message::Message(&local_1a18);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1a40,(internal *)local_1a08,(AssertionResult *)"psbt.IsFinalized()","false",
               "true",(char *)value);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x4cc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a20,&local_1a18);
    testing::internal::AssertHelper::~AssertHelper(&local_1a20);
    std::__cxx11::string::~string((string *)&local_1a40);
    testing::Message::~Message((Message *)0x2a5832);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2a58ad);
  cfd::core::Psbt::ExtractTransaction(&local_1a80,&local_88);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (&local_1ab0,&local_1a80.super_AbstractTransaction);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1a90,
             "\"02000000000101692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d5400000000232200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc0400473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b840147304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc0147522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae00000000\""
             ,"tx.GetHex().c_str()",
             "02000000000101692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d5400000000232200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc0400473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b840147304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc0147522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae00000000"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_1ab0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a90);
  if (!bVar1) {
    testing::Message::Message(&local_1ab8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2a59c4);
    testing::internal::AssertHelper::AssertHelper
              (&local_1ac0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x4ce,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1ac0,&local_1ab8);
    testing::internal::AssertHelper::~AssertHelper(&local_1ac0);
    testing::Message::~Message((Message *)0x2a5a21);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2a5a76);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_ffffffffffffe200);
  cfd::Psbt::~Psbt((Psbt *)in_stack_ffffffffffffe200);
  cfd::Psbt::~Psbt((Psbt *)in_stack_ffffffffffffe200);
  cfd::core::TxIn::~TxIn((TxIn *)0x2a5cc6);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_ffffffffffffe200);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffe200);
  cfd::core::KeyData::~KeyData((KeyData *)in_stack_ffffffffffffe200);
  cfd::core::KeyData::~KeyData((KeyData *)in_stack_ffffffffffffe200);
  std::__cxx11::string::~string((string *)&local_5f8);
  cfd::core::Address::~Address(in_stack_ffffffffffffe200);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffe200);
  cfd::core::KeyData::~KeyData((KeyData *)in_stack_ffffffffffffe200);
  cfd::core::KeyData::~KeyData((KeyData *)in_stack_ffffffffffffe200);
  std::__cxx11::string::~string((string *)&local_118);
  cfd::core::HDWallet::~HDWallet((HDWallet *)0x2a5d55);
  cfd::core::HDWallet::~HDWallet((HDWallet *)0x2a5d62);
  cfd::Psbt::~Psbt((Psbt *)in_stack_ffffffffffffe200);
  return;
}

Assistant:

TEST(Psbt, UsecaseMultisig) {
  Psbt psbt;
  
  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/0/12";
  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path1);
  auto out_multisig = ScriptUtil::CreateMultisigRedeemScript(
    2, std::vector<Pubkey>{key1.GetPubkey(), key2.GetPubkey()});
  auto addr = Address(NetType::kTestnet, WitnessVersion::kVersion0, out_multisig);

  std::string in_path = "44h/0h/0h/0/11";
  auto key_in1 = wallet1.GeneratePrivkeyData(NetType::kTestnet, in_path);
  auto key_in2 = wallet2.GeneratePrivkeyData(NetType::kTestnet, in_path);
  auto multisig = ScriptUtil::CreateMultisigRedeemScript(
    2, std::vector<Pubkey>{key_in1.GetPubkey(), key_in2.GetPubkey()});
  EXPECT_STREQ("522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae", multisig.GetHex().c_str());

  Transaction utxo_tx(g_psbt_utxo_sh_wsh_multi);
  TxIn txin(Txid("544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69"), 0, 0xffffffff);

  try {
    psbt.AddTxIn(txin);
    psbt.SetTxInUtxo(0, utxo_tx.GetTxOut(0), multisig, KeyData());
    psbt.SetTxInSighashType(0, SigHashType());
    EXPECT_STREQ("522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae",
        psbt.GetTxInRedeemScriptDirect(0, true, true).GetHex().c_str());
    EXPECT_STREQ("00209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9",
        psbt.GetTxInRedeemScriptDirect(0, true, false).GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  Amount amount(499993360);
  try {
    psbt.AddTxOut(addr.GetLockingScript(), amount);
    psbt.SetTxOutData(0, out_multisig, std::vector<KeyData>{key1, key2});
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  Psbt psbt1;
  try {
    psbt1.AddTxIn(txin);
    psbt1.SetTxInUtxo(0, utxo_tx.GetTxOut(0), multisig, key_in1);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  Psbt psbt2;
  try {
    psbt2.AddTxIn(txin);
    psbt2.SetTxInUtxo(0, utxo_tx.GetTxOut(0), multisig, key_in2);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt.Join(psbt1);
    psbt.Join(psbt2);
    EXPECT_STREQ("70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f23175870103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000", psbt.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQMEAQAAAAEEIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBBUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSriIGA6US9fWcDnkB/EeO1jU+73b0T5yywYW/vPfwubt2cWvzGCpwR2AsAACAAAAAgAAAAIAAAAAACwAAACIGA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHGJ1rbYYsAACAAAAAgAAAAIAAAAAACwAAAAABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA=", psbt.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt1 = psbt;
    psbt1.Sign(key_in1.GetPrivkey());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt2 = psbt;
    // psbt2.Sign(key_in2.GetPrivkey());
    // Same processing.
    auto sighash_type = psbt.GetTxInSighashType(0);
    auto utxo_txout = psbt.GetTxInUtxo(0);
    auto tx = psbt.GetTransaction();
    auto sighash = tx.GetSignatureHash(0, psbt.GetTxInRedeemScript(0).GetData(),
        sighash_type, utxo_txout.GetValue(), WitnessVersion::kVersion0);
    auto sig = key_in2.GetPrivkey().CalculateEcSignature(sighash);
    sig = CryptoUtil::ConvertSignatureToDer(sig, sighash_type);
    psbt2.SetTxInSignature(0, key_in2, sig);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt.Combine(psbt1);
    psbt.Combine(psbt2);
    EXPECT_STREQ("70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587220203a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401220203f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4747304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc010103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000", psbt.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQFHUiECkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnshAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCUq4iAgJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQhida22GLAAAgAAAAIAAAACAAAAAAAwAAAAiAgKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGexgqcEdgLAAAgAAAAIAAAACAAAAAAAwAAAAA", psbt.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    auto sig1 = psbt.GetTxInSignature(0, key_in1.GetPubkey());
    auto sig2 = psbt.GetTxInSignature(0, key_in2.GetPubkey());
    auto script = psbt.GetTxInRedeemScript(0);
    EXPECT_FALSE(psbt.IsFinalizedInput(0));
    EXPECT_FALSE(psbt.IsFinalized());
    psbt.SetTxInFinalScript(
        0, std::vector<ByteData>{ByteData(), sig1, sig2, script.GetData()});
    // psbt.Finalize();
    EXPECT_TRUE(psbt.IsFinalizedInput(0));
    psbt.ClearTxInSignData(0);

    auto wit_script = psbt.GetTxInFinalScript(0, true);
    auto wsh_script = psbt.GetTxInFinalScript(0, false);
    EXPECT_EQ(4, wit_script.size());
    if (4 == wit_script.size()) {
      EXPECT_EQ(script.GetHex(), wit_script[3].GetHex());
    }
    EXPECT_EQ(1, wsh_script.size());
    if (1 == wsh_script.size()) {
      auto exp_script = ScriptUtil::CreateP2wshLockingScript(script);
      EXPECT_EQ(exp_script.GetData().Serialize().GetHex(), wsh_script[0].GetHex());
    }
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    EXPECT_TRUE(psbt.IsFinalized());
    auto tx = psbt.ExtractTransaction();
    EXPECT_STREQ("02000000000101692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d5400000000232200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc0400473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b840147304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc0147522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae00000000", tx.GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }
}